

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_psraw_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  
  uVar1 = 0xf;
  if (s->_q_MMXReg[0] < 0xf) {
    uVar1 = s->_q_MMXReg[0];
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = d->_q_MMXReg[0];
  auVar2 = psraw(auVar2,ZEXT416((uint)uVar1));
  d->_q_MMXReg[0] = auVar2._0_8_;
  return;
}

Assistant:

void glue(helper_psraw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 15) {
        shift = 15;
    } else {
        shift = s->B(0);
    }
    d->W(0) = (int16_t)d->W(0) >> shift;
    d->W(1) = (int16_t)d->W(1) >> shift;
    d->W(2) = (int16_t)d->W(2) >> shift;
    d->W(3) = (int16_t)d->W(3) >> shift;
#if SHIFT == 1
    d->W(4) = (int16_t)d->W(4) >> shift;
    d->W(5) = (int16_t)d->W(5) >> shift;
    d->W(6) = (int16_t)d->W(6) >> shift;
    d->W(7) = (int16_t)d->W(7) >> shift;
#endif
}